

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qprocess.cpp
# Opt level: O0

void __thiscall QProcess::setStandardInputFile(QProcess *this,QString *fileName)

{
  QString *in_RDI;
  QProcessPrivate *d;
  
  d_func((QProcess *)0x790d1c);
  QProcessPrivate::Channel::operator=((Channel *)d,in_RDI);
  return;
}

Assistant:

void QProcess::setStandardInputFile(const QString &fileName)
{
    Q_D(QProcess);
    d->stdinChannel = fileName;
}